

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O3

bool __thiscall
cmVariableWatch::VariableAccessed
          (cmVariableWatch *this,string *variable,int access_type,char *newValue,cmMakefile *mf)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Atomic_word _Var3;
  const_iterator cVar4;
  _Rb_tree_header *p_Var5;
  pointer pwVar6;
  bool bVar7;
  vector<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
  vp;
  allocator_type local_5d;
  int local_5c;
  char *local_58;
  cmMakefile *local_50;
  vector<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
  local_48;
  
  local_5c = access_type;
  local_58 = newValue;
  local_50 = mf;
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>_>
                  *)this,variable);
  p_Var5 = &(this->WatchMap)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar4._M_node != p_Var5) {
    std::
    vector<std::weak_ptr<cmVariableWatch::Pair>,std::allocator<std::weak_ptr<cmVariableWatch::Pair>>>
    ::
    vector<__gnu_cxx::__normal_iterator<std::shared_ptr<cmVariableWatch::Pair>const*,std::vector<std::shared_ptr<cmVariableWatch::Pair>,std::allocator<std::shared_ptr<cmVariableWatch::Pair>>>>,void>
              ((vector<std::weak_ptr<cmVariableWatch::Pair>,std::allocator<std::weak_ptr<cmVariableWatch::Pair>>>
                *)&local_48,*(shared_ptr<cmVariableWatch::Pair> **)(cVar4._M_node + 2),
               (shared_ptr<cmVariableWatch::Pair> *)cVar4._M_node[2]._M_parent,&local_5d);
    for (pwVar6 = local_48.
                  super__Vector_base<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pwVar6 != local_48.
                  super__Vector_base<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pwVar6 = pwVar6 + 1) {
      this_00 = (pwVar6->super___weak_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var3 = this_00->_M_use_count;
        do {
          if (_Var3 == 0) goto LAB_001b2e55;
          LOCK();
          iVar1 = this_00->_M_use_count;
          bVar7 = _Var3 == iVar1;
          if (bVar7) {
            this_00->_M_use_count = _Var3 + 1;
            iVar1 = _Var3;
          }
          _Var3 = iVar1;
          UNLOCK();
        } while (!bVar7);
        peVar2 = (pwVar6->super___weak_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (peVar2 != (element_type *)0x0 && this_00->_M_use_count != 0) {
          (*peVar2->Method)(variable,local_5c,peVar2->ClientData,local_58,local_50);
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
LAB_001b2e55:
    }
    std::
    vector<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
    ::~vector(&local_48);
  }
  return (_Rb_tree_header *)cVar4._M_node != p_Var5;
}

Assistant:

bool cmVariableWatch::VariableAccessed(const std::string& variable,
                                       int access_type, const char* newValue,
                                       const cmMakefile* mf) const
{
  cmVariableWatch::StringToVectorOfPairs::const_iterator mit =
    this->WatchMap.find(variable);
  if (mit != this->WatchMap.end()) {
    // The strategy here is to copy the list of callbacks, and ignore
    // new callbacks that existing ones may add.
    std::vector<std::weak_ptr<Pair>> vp(mit->second.begin(),
                                        mit->second.end());
    for (auto& weak_it : vp) {
      // In the case where a callback was removed, the weak_ptr will not be
      // lockable, and so this ensures we don't attempt to call into freed
      // memory
      if (auto it = weak_it.lock()) {
        it->Method(variable, access_type, it->ClientData, newValue, mf);
      }
    }
    return true;
  }
  return false;
}